

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O2

Gia_Man_t * Dau_ConstructAigFromFile(char *pFileName)

{
  FILE *__stream;
  Gia_Man_t *p;
  size_t sVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  undefined8 uStack_420;
  char Buffer [1000];
  
  uStack_420 = 0x4417d1;
  __stream = fopen(pFileName,"rb");
  pcVar4 = (char *)0x3e8;
  uStack_420 = 0x4417de;
  p = Gia_ManStart(1000);
  uStack_420 = 0x4417e6;
  pcVar4 = Abc_UtilStrsav(pcVar4);
  p->pName = pcVar4;
  uStack_420 = 0x4417f1;
  Gia_ManHashAlloc(p);
  iVar2 = 5;
  while (bVar5 = iVar2 != 0, iVar2 = iVar2 + -1, bVar5) {
    uStack_420 = 0x441801;
    Gia_ManAppendCi(p);
  }
  uVar3 = 0;
  while( true ) {
    uStack_420 = 0x44181d;
    pcVar4 = fgets(Buffer,1000,__stream);
    if (pcVar4 == (char *)0x0) break;
    uStack_420 = 0x44182a;
    sVar1 = strlen(Buffer);
    if (Buffer[sVar1 - 1] == '\n') {
      Buffer[sVar1 - 1] = '\0';
    }
    uStack_420 = 0x44183f;
    sVar1 = strlen(Buffer);
    if (Buffer[sVar1 - 1] == '\r') {
      Buffer[sVar1 - 1] = '\0';
    }
    uStack_420 = 0x441857;
    iVar2 = Dau_ParseFormulaAig(p,Buffer + 0xb);
    uStack_420 = 0x441861;
    Gia_ManAppendCo(p,iVar2);
    uVar3 = uVar3 + 1;
  }
  uStack_420 = 0x441875;
  printf("Finish constructing AIG for %d structures.\n",(ulong)uVar3);
  return p;
}

Assistant:

Gia_Man_t * Dau_ConstructAigFromFile( char * pFileName )
{
    char Buffer[1000];
    int i, nLines = 0;
    FILE * pFile = fopen( pFileName, "rb" );
    Gia_Man_t * p = Gia_ManStart( 1000 );
    p->pName = Abc_UtilStrsav( "func_enum_aig" );
    Gia_ManHashAlloc( p );
    for ( i = 0; i < 5; i++ )
        Gia_ManAppendCi( p );
    while ( fgets( Buffer, 1000, pFile ) )
    {
        if ( Buffer[strlen(Buffer)-1] == '\n' )
            Buffer[strlen(Buffer)-1] = 0;
        if ( Buffer[strlen(Buffer)-1] == '\r' )
            Buffer[strlen(Buffer)-1] = 0;
        Gia_ManAppendCo( p, Dau_ParseFormulaAig(p, Buffer + 11) );
        nLines++;
    }
    printf( "Finish constructing AIG for %d structures.\n", nLines );
    return p;
}